

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::setSamplesToZero
          (TypedDeepImageChannel<Imath_3_2::half> *this,size_t i,uint oldNumSamples,
          uint newNumSamples)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)oldNumSamples;
  lVar1 = uVar2 * 2;
  for (; uVar2 < newNumSamples; uVar2 = uVar2 + 1) {
    Imath_3_2::half::operator=((half *)((long)&this->_sampleListPointers[i]->_h + lVar1),0.0);
    lVar1 = lVar1 + 2;
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::setSamplesToZero (
    size_t i, unsigned int oldNumSamples, unsigned int newNumSamples)
{
    //
    // Expand the size of a sample list for a single pixel and
    // set the new samples in the list to 0.
    //
    // i                The position of the affected pixel in
    //                  the channel's _sampleListPointers.
    //
    // oldNumSamples    Original number of samples in the sample list.
    //
    // newNumSamples    New number of samples in the sample list.
    //

    for (unsigned int j = oldNumSamples; j < newNumSamples; ++j)
        _sampleListPointers[i][j] = 0;
}